

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O3

sunindextype denseGETRF(realtype **a,sunindextype m,sunindextype n,sunindextype *p)

{
  realtype rVar1;
  double dVar2;
  realtype *prVar3;
  realtype *prVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  if (n < 1) {
    return 0;
  }
  lVar5 = 0;
  do {
    prVar3 = a[lVar5];
    lVar6 = lVar5 + 1;
    lVar8 = lVar5;
    for (lVar9 = lVar6; lVar9 < m; lVar9 = lVar9 + 1) {
      lVar7 = lVar9;
      if (ABS(prVar3[lVar9]) <= ABS(prVar3[lVar8])) {
        lVar7 = lVar8;
      }
      lVar8 = lVar7;
    }
    p[lVar5] = lVar8;
    if ((prVar3[lVar8] == 0.0) && (!NAN(prVar3[lVar8]))) {
      return lVar6;
    }
    if (lVar8 != lVar5) {
      lVar9 = 0;
      do {
        prVar4 = a[lVar9];
        rVar1 = prVar4[lVar8];
        prVar4[lVar8] = prVar4[lVar5];
        prVar4[lVar5] = rVar1;
        lVar9 = lVar9 + 1;
      } while (n != lVar9);
    }
    lVar9 = lVar6;
    if (lVar6 < m) {
      dVar2 = prVar3[lVar5];
      lVar8 = lVar6;
      do {
        prVar3[lVar8] = prVar3[lVar8] * (1.0 / dVar2);
        lVar8 = lVar8 + 1;
      } while (lVar8 < m);
    }
    for (; lVar9 < n; lVar9 = lVar9 + 1) {
      prVar4 = a[lVar9];
      dVar2 = prVar4[lVar5];
      if (dVar2 != 0.0 && lVar6 < m) {
        lVar8 = lVar6;
        do {
          prVar4[lVar8] = prVar3[lVar8] * -dVar2 + prVar4[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 < m);
      }
    }
    lVar5 = lVar6;
  } while (lVar6 != n);
  return 0;
}

Assistant:

sunindextype denseGETRF(realtype **a, sunindextype m, sunindextype n, sunindextype *p)
{
  sunindextype i, j, k, l;
  realtype *col_j, *col_k;
  realtype temp, mult, a_kj;

  /* k-th elimination step number */
  for (k=0; k < n; k++) {

    col_k  = a[k];

    /* find l = pivot row number */
    l=k;
    for (i=k+1; i < m; i++)
      if (SUNRabs(col_k[i]) > SUNRabs(col_k[l])) l=i;
    p[k] = l;

    /* check for zero pivot element */
    if (col_k[l] == ZERO) return(k+1);
    
    /* swap a(k,1:n) and a(l,1:n) if necessary */    
    if ( l!= k ) {
      for (i=0; i<n; i++) {
        temp = a[i][l];
        a[i][l] = a[i][k];
        a[i][k] = temp;
      }
    }

    /* Scale the elements below the diagonal in
     * column k by 1.0/a(k,k). After the above swap
     * a(k,k) holds the pivot element. This scaling
     * stores the pivot row multipliers a(i,k)/a(k,k)
     * in a(i,k), i=k+1, ..., m-1.                      
     */
    mult = ONE/col_k[k];
    for(i=k+1; i < m; i++) col_k[i] *= mult;

    /* row_i = row_i - [a(i,k)/a(k,k)] row_k, i=k+1, ..., m-1 */
    /* row k is the pivot row after swapping with row l.      */
    /* The computation is done one column at a time,          */
    /* column j=k+1, ..., n-1.                                */

    for (j=k+1; j < n; j++) {

      col_j = a[j];
      a_kj = col_j[k];

      /* a(i,j) = a(i,j) - [a(i,k)/a(k,k)]*a(k,j)  */
      /* a_kj = a(k,j), col_k[i] = - a(i,k)/a(k,k) */

      if (a_kj != ZERO) {
	for (i=k+1; i < m; i++)
	  col_j[i] -= a_kj * col_k[i];
      }
    }
  }

  /* return 0 to indicate success */

  return(0);
}